

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::OptionDetails::OptionDetails(OptionDetails *this,OptionDetails *rhs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (this->m_short)._M_dataplus._M_p = (pointer)&(this->m_short).field_2;
  (this->m_short)._M_string_length = 0;
  (this->m_short).field_2._M_local_buf[0] = '\0';
  (this->m_long)._M_dataplus._M_p = (pointer)&(this->m_long).field_2;
  (this->m_long)._M_string_length = 0;
  (this->m_long).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->m_desc,&rhs->m_desc);
  (*((rhs->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Value[2])(&local_28);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  this->m_count = rhs->m_count;
  this->m_hash = 0;
  return;
}

Assistant:

OptionDetails(const OptionDetails& rhs)
    : m_desc(rhs.m_desc)
    , m_value(rhs.m_value->clone())
    , m_count(rhs.m_count)
    {
    }